

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::RunContext::assertionEnded(RunContext *this,AssertionResult *result)

{
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages;
  long *plVar1;
  OfType OVar2;
  IStreamingReporter *pIVar3;
  int iVar4;
  long lVar5;
  string local_168;
  string local_148;
  undefined1 local_128 [48];
  _Alloc_hider local_f8;
  char local_e8 [112];
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> local_78 [3];
  
  OVar2 = (result->m_resultData).resultType;
  if (OVar2 == Ok) {
    lVar5 = 0x100;
  }
  else if (((OVar2 & FailureBit) == Ok) ||
          (lVar5 = 0x108, ((result->m_info).resultDisposition & SuppressFail) != 0))
  goto LAB_00123ab9;
  plVar1 = (long *)((long)&(this->super_IResultCapture)._vptr_IResultCapture + lVar5);
  *plVar1 = *plVar1 + 1;
LAB_00123ab9:
  pIVar3 = (this->m_reporter).m_p;
  _infoMessages = &this->m_messages;
  AssertionStats::AssertionStats((AssertionStats *)local_128,result,_infoMessages,&this->m_totals);
  iVar4 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])
                    (pIVar3,(AssertionStats *)local_128);
  local_128._0_8_ = &PTR__AssertionStats_00161480;
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(local_78);
  AssertionResult::~AssertionResult((AssertionResult *)(local_128 + 8));
  if ((char)iVar4 != '\0') {
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
              (_infoMessages,
               (_infoMessages->
               super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
               super__Vector_impl_data._M_start);
  }
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_168,"{Unknown expression after the reported line}","");
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)local_128,&local_148,&(this->m_lastAssertionInfo).lineInfo,&local_168,
             (this->m_lastAssertionInfo).resultDisposition);
  std::__cxx11::string::operator=((string *)&this->m_lastAssertionInfo,(string *)local_128);
  (this->m_lastAssertionInfo).lineInfo.file = (char *)local_128._32_8_;
  (this->m_lastAssertionInfo).lineInfo.line = local_128._40_8_;
  std::__cxx11::string::operator=
            ((string *)&(this->m_lastAssertionInfo).capturedExpression,(string *)&local_f8);
  (this->m_lastAssertionInfo).resultDisposition = local_e8._16_4_;
  if (local_f8._M_p != local_e8) {
    operator_delete(local_f8._M_p);
  }
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  AssertionResult::operator=(&this->m_lastResult,result);
  return;
}

Assistant:

virtual void assertionEnded( AssertionResult const& result ) {
            if( result.getResultType() == ResultWas::Ok ) {
                m_totals.assertions.passed++;
            }
            else if( !result.isOk() ) {
                m_totals.assertions.failed++;
            }

            if( m_reporter->assertionEnded( AssertionStats( result, m_messages, m_totals ) ) )
                m_messages.clear();

            // Reset working state
            m_lastAssertionInfo = AssertionInfo( std::string(), m_lastAssertionInfo.lineInfo, "{Unknown expression after the reported line}" , m_lastAssertionInfo.resultDisposition );
            m_lastResult = result;
        }